

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_clbl_decode_processor(void *user_data,opj_tls_t *tls)

{
  OPJ_UINT32 *pOVar1;
  int *piVar2;
  float *pfVar3;
  float fVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long *plVar10;
  long lVar11;
  opj_event_mgr_t *p_event_mgr;
  opj_mutex_t *mutex;
  opj_mqc_state_t *poVar12;
  uint *puVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  OPJ_BOOL OVar23;
  void *__s;
  opj_t1_t *t1;
  OPJ_BYTE *pOVar24;
  uint *puVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  opj_flag_t *poVar39;
  ulong uVar40;
  ulong uVar41;
  int *piVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  OPJ_UINT32 OVar49;
  int iVar50;
  opj_mqc_state_t **ppoVar51;
  OPJ_BYTE *pOVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  uint *puVar56;
  ulong uVar57;
  OPJ_UINT32 OVar58;
  OPJ_INT32 *pOVar59;
  opj_mqc_t *mqc;
  size_t size;
  int *piVar60;
  uint uVar61;
  int *piVar62;
  ulong uVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  uint local_b4;
  OPJ_BYTE *local_78;
  OPJ_INT32 *local_58;
  
  plVar10 = *(long **)((long)user_data + 8);
  if (*user_data == 0) {
    size = (ulong)(uint)(*(int *)((long)plVar10 + 0x1c) - *(int *)((long)plVar10 + 0x14)) *
           (ulong)(uint)((int)plVar10[3] - (int)plVar10[2]) * 4;
    __s = opj_aligned_malloc(size);
    plVar10[8] = (long)__s;
    if (__s != (void *)0x0) {
      memset(__s,0,size);
      goto LAB_00122b1b;
    }
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_lock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                  "Cannot allocate cblk->decoded_data\n");
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_unlock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    goto LAB_00122dd4;
  }
  if ((void *)plVar10[8] != (void *)0x0) {
    opj_aligned_free((void *)plVar10[8]);
    plVar10[8] = 0;
  }
LAB_00122b1b:
  iVar6 = *(int *)((long)user_data + 4);
  piVar60 = *(int **)((long)user_data + 0x10);
  lVar26 = *(long *)((long)user_data + 0x18);
  lVar11 = *(long *)((long)user_data + 0x20);
  lVar30 = (ulong)(*(int *)(lVar26 + 0x18) - 1) * 0xc0;
  iVar7 = *(int *)(*(long *)(lVar26 + 0x20) + 8 + lVar30);
  iVar8 = *(int *)(*(long *)(lVar26 + 0x20) + lVar30);
  if (**(int **)((long)user_data + 0x30) == 0) goto LAB_00122ddd;
  t1 = (opj_t1_t *)opj_tls_get(tls,0);
  if (t1 == (opj_t1_t *)0x0) {
    t1 = opj_t1_create(0);
    opj_tls_set(tls,0,t1,opj_t1_destroy_wrapper);
  }
  t1->mustuse_cblkdatabuffer = *(OPJ_BOOL *)((long)user_data + 0x28);
  iVar33 = *(int *)(lVar11 + 0x328);
  uVar48 = *(uint *)(lVar11 + 0x10);
  p_event_mgr = *(opj_event_mgr_t **)((long)user_data + 0x38);
  mutex = *(opj_mutex_t **)((long)user_data + 0x40);
  iVar50 = *(int *)((long)user_data + 0x48);
  (t1->mqc).lut_ctxno_zc_orient = "" + (uint)(piVar60[4] << 9);
  OVar23 = opj_t1_allocate_buffers
                     (t1,(int)plVar10[3] - (int)plVar10[2],
                      *(int *)((long)plVar10 + 0x1c) - *(int *)((long)plVar10 + 0x14));
  if (OVar23 != 0) {
    uVar35 = iVar33 + (int)plVar10[4];
    if ((int)uVar35 < 0x1f) {
      opj_mqc_resetstates(&t1->mqc);
      uVar34 = 0;
      opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
      opj_mqc_setstate(&t1->mqc,0x11,0,3);
      opj_mqc_setstate(&t1->mqc,0,0,4);
      uVar36 = *(uint *)(plVar10 + 7);
      if (((ulong)uVar36 < 2) && (t1->mustuse_cblkdatabuffer == 0)) {
        if (uVar36 == 1) {
          local_78 = *(OPJ_BYTE **)plVar10[1];
          goto LAB_00122e15;
        }
      }
      else {
        for (lVar30 = 0; (ulong)uVar36 << 4 != lVar30; lVar30 = lVar30 + 0x10) {
          uVar34 = (ulong)(uint)((int)uVar34 + *(int *)(plVar10[1] + 8 + lVar30));
        }
        uVar36 = (int)uVar34 + 2;
        if (t1->cblkdatabuffersize < uVar36) {
          pOVar24 = (OPJ_BYTE *)opj_realloc(t1->cblkdatabuffer,(ulong)uVar36);
          if (pOVar24 == (OPJ_BYTE *)0x0) goto LAB_00122dd4;
          t1->cblkdatabuffer = pOVar24;
          (pOVar24 + uVar34)[0] = '\0';
          (pOVar24 + uVar34)[1] = '\0';
          t1->cblkdatabuffersize = uVar36;
        }
        local_78 = t1->cblkdatabuffer;
        lVar30 = 8;
        uVar36 = 0;
        for (uVar34 = 0; uVar34 < *(uint *)(plVar10 + 7); uVar34 = uVar34 + 1) {
          memcpy(local_78 + uVar36,*(void **)(plVar10[1] + -8 + lVar30),
                 (ulong)*(uint *)(plVar10[1] + lVar30));
          uVar36 = uVar36 + *(int *)(plVar10[1] + lVar30);
          lVar30 = lVar30 + 0x10;
        }
LAB_00122e15:
        if ((OPJ_INT32 *)plVar10[8] == (OPJ_INT32 *)0x0) {
          local_58 = (OPJ_INT32 *)0x0;
        }
        else {
          local_58 = t1->data;
          t1->data = (OPJ_INT32 *)plVar10[8];
        }
        uVar36 = 2;
        local_b4 = 0;
        for (uVar34 = 0; uVar34 < *(uint *)(plVar10 + 6); uVar34 = uVar34 + 1) {
          bVar66 = (uVar48 & 1) == 0;
          lVar30 = *plVar10;
          bVar65 = (int)plVar10[4] + -4 < (int)uVar35;
          bVar64 = 1 < uVar36;
          OVar49 = *(OPJ_UINT32 *)(lVar30 + uVar34 * 0x18);
          if ((bVar64 || bVar66) || bVar65) {
            opj_mqc_init_dec(&t1->mqc,local_78 + local_b4,OVar49,2);
          }
          else {
            opj_mqc_raw_init_dec(&t1->mqc,local_78 + local_b4,OVar49,2);
          }
          piVar62 = (int *)(lVar30 + uVar34 * 0x18);
          local_b4 = local_b4 + *piVar62;
          uVar29 = 0;
          for (; (uVar29 < (uint)piVar62[2] && (0 < (int)uVar35)); uVar35 = uVar35 - (uVar28 == 3))
          {
            if (uVar36 == 2) {
              opj_t1_dec_clnpass(t1,uVar35,uVar48);
            }
            else {
              bVar27 = (byte)uVar35;
              if (uVar36 == 1) {
                if ((bVar64 || bVar66) || bVar65) {
                  uVar28 = t1->w;
                  uVar41 = (ulong)uVar28;
                  if (uVar41 == 0x40) {
                    puVar25 = (uint *)t1->data;
                    poVar39 = t1->flags;
                    ppoVar51 = (t1->mqc).curctx;
                    uVar32 = (t1->mqc).c;
                    uVar47 = (t1->mqc).a;
                    OVar49 = (t1->mqc).ct;
                    if (t1->h == 0x40) {
                      puVar56 = poVar39 + 0x43;
                      uVar43 = (uint)(1 << (bVar27 & 0x1f)) >> 1;
                      uVar44 = -uVar43;
                      for (uVar28 = 0; uVar28 < 0x40; uVar28 = uVar28 + 4) {
                        for (iVar33 = 0; iVar33 != 0x40; iVar33 = iVar33 + 1) {
                          uVar37 = *puVar56;
                          if (uVar37 != 0) {
                            if ((uVar37 & 0x200010) == 0x10) {
                              uVar41 = (ulong)(0xf - ((uVar37 & 0x1ef) == 0));
                              if ((uVar37 >> 0x14 & 1) != 0) {
                                uVar41 = 0x10;
                              }
                              ppoVar51 = (t1->mqc).ctxs + uVar41;
                              poVar12 = *ppoVar51;
                              uVar46 = poVar12->qeval;
                              uVar53 = uVar47 - uVar46;
                              if (uVar32 >> 0x10 < uVar46) {
                                uVar38 = poVar12->mps;
                                *ppoVar51 = (&poVar12->nmps)[uVar46 <= uVar53];
                                uVar47 = uVar46;
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (t1->mqc).bp;
                                    bVar27 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar27 < 0x90) {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_00123071;
                                      }
                                      uVar32 = uVar32 + 0xff00;
                                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_00123071:
                                  uVar47 = uVar47 * 2;
                                  uVar32 = uVar32 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar47 < 0x8000);
                                uVar45 = (uint)(uVar38 == 0);
                                if (uVar53 < uVar46) {
                                  uVar45 = uVar38;
                                }
                              }
                              else {
                                uVar32 = uVar32 + uVar46 * -0x10000;
                                uVar47 = uVar53;
                                if ((short)uVar53 < 0) {
                                  uVar45 = poVar12->mps;
                                }
                                else {
                                  uVar38 = poVar12->mps;
                                  *ppoVar51 = (&poVar12->nmps)[uVar53 < uVar46];
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (t1->mqc).bp;
                                      bVar27 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar27 < 0x90) {
                                          (t1->mqc).bp = pOVar24 + 1;
                                          uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_00123100;
                                        }
                                        uVar32 = uVar32 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_00123100:
                                    uVar47 = uVar47 * 2;
                                    uVar32 = uVar32 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar47 < 0x8000);
                                  uVar45 = (uint)(uVar38 == 0);
                                  if (uVar46 <= uVar53) {
                                    uVar45 = uVar38;
                                  }
                                }
                              }
                              uVar46 = uVar43;
                              if (uVar45 == *puVar25 >> 0x1f) {
                                uVar46 = uVar44;
                              }
                              *puVar25 = uVar46 + *puVar25;
                              uVar37 = uVar37 | 0x100000;
                            }
                            if ((uVar37 & 0x1000080) == 0x80) {
                              uVar41 = (ulong)(0xf - ((uVar37 & 0xf78) == 0));
                              if ((uVar37 >> 0x17 & 1) != 0) {
                                uVar41 = 0x10;
                              }
                              ppoVar51 = (t1->mqc).ctxs + uVar41;
                              poVar12 = *ppoVar51;
                              uVar46 = poVar12->qeval;
                              uVar53 = uVar47 - uVar46;
                              if (uVar32 >> 0x10 < uVar46) {
                                uVar38 = poVar12->mps;
                                *ppoVar51 = (&poVar12->nmps)[uVar46 <= uVar53];
                                uVar47 = uVar46;
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (t1->mqc).bp;
                                    bVar27 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar27 < 0x90) {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_00123214;
                                      }
                                      uVar32 = uVar32 + 0xff00;
                                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_00123214:
                                  uVar47 = uVar47 * 2;
                                  uVar32 = uVar32 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar47 < 0x8000);
                                uVar45 = (uint)(uVar38 == 0);
                                if (uVar53 < uVar46) {
                                  uVar45 = uVar38;
                                }
                              }
                              else {
                                uVar32 = uVar32 + uVar46 * -0x10000;
                                uVar47 = uVar53;
                                if ((short)uVar53 < 0) {
                                  uVar45 = poVar12->mps;
                                }
                                else {
                                  uVar38 = poVar12->mps;
                                  *ppoVar51 = (&poVar12->nmps)[uVar53 < uVar46];
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (t1->mqc).bp;
                                      bVar27 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar27 < 0x90) {
                                          (t1->mqc).bp = pOVar24 + 1;
                                          uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_001232a3;
                                        }
                                        uVar32 = uVar32 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_001232a3:
                                    uVar47 = uVar47 * 2;
                                    uVar32 = uVar32 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar47 < 0x8000);
                                  uVar45 = (uint)(uVar38 == 0);
                                  if (uVar46 <= uVar53) {
                                    uVar45 = uVar38;
                                  }
                                }
                              }
                              uVar46 = uVar43;
                              if (uVar45 == puVar25[0x40] >> 0x1f) {
                                uVar46 = uVar44;
                              }
                              puVar25[0x40] = uVar46 + puVar25[0x40];
                              uVar37 = uVar37 | 0x800000;
                            }
                            if ((uVar37 & 0x8000400) == 0x400) {
                              uVar41 = (ulong)(0xf - ((uVar37 & 0x7bc0) == 0));
                              if ((uVar37 >> 0x1a & 1) != 0) {
                                uVar41 = 0x10;
                              }
                              ppoVar51 = (t1->mqc).ctxs + uVar41;
                              poVar12 = *ppoVar51;
                              uVar46 = poVar12->qeval;
                              uVar53 = uVar47 - uVar46;
                              if (uVar32 >> 0x10 < uVar46) {
                                uVar38 = poVar12->mps;
                                *ppoVar51 = (&poVar12->nmps)[uVar46 <= uVar53];
                                uVar47 = uVar46;
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (t1->mqc).bp;
                                    bVar27 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar27 < 0x90) {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_001233bf;
                                      }
                                      uVar32 = uVar32 + 0xff00;
                                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_001233bf:
                                  uVar47 = uVar47 * 2;
                                  uVar32 = uVar32 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar47 < 0x8000);
                                uVar45 = (uint)(uVar38 == 0);
                                if (uVar53 < uVar46) {
                                  uVar45 = uVar38;
                                }
                              }
                              else {
                                uVar32 = uVar32 + uVar46 * -0x10000;
                                uVar47 = uVar53;
                                if ((short)uVar53 < 0) {
                                  uVar45 = poVar12->mps;
                                }
                                else {
                                  uVar38 = poVar12->mps;
                                  *ppoVar51 = (&poVar12->nmps)[uVar53 < uVar46];
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (t1->mqc).bp;
                                      bVar27 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar27 < 0x90) {
                                          (t1->mqc).bp = pOVar24 + 1;
                                          uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_0012344e;
                                        }
                                        uVar32 = uVar32 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_0012344e:
                                    uVar47 = uVar47 * 2;
                                    uVar32 = uVar32 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar47 < 0x8000);
                                  uVar45 = (uint)(uVar38 == 0);
                                  if (uVar46 <= uVar53) {
                                    uVar45 = uVar38;
                                  }
                                }
                              }
                              uVar46 = uVar43;
                              if (uVar45 == puVar25[0x80] >> 0x1f) {
                                uVar46 = uVar44;
                              }
                              puVar25[0x80] = uVar46 + puVar25[0x80];
                              uVar37 = uVar37 | 0x4000000;
                            }
                            if ((uVar37 & 0x40002000) == 0x2000) {
                              uVar41 = (ulong)(0xf - ((uVar37 & 0x3de00) == 0));
                              if ((uVar37 >> 0x1d & 1) != 0) {
                                uVar41 = 0x10;
                              }
                              ppoVar51 = (t1->mqc).ctxs + uVar41;
                              poVar12 = *ppoVar51;
                              uVar46 = poVar12->qeval;
                              uVar53 = uVar47 - uVar46;
                              if (uVar32 >> 0x10 < uVar46) {
                                uVar38 = poVar12->mps;
                                *ppoVar51 = (&poVar12->nmps)[uVar46 <= uVar53];
                                uVar47 = uVar46;
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (t1->mqc).bp;
                                    bVar27 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar27 < 0x90) {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_0012356a;
                                      }
                                      uVar32 = uVar32 + 0xff00;
                                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_0012356a:
                                  uVar47 = uVar47 * 2;
                                  uVar32 = uVar32 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar47 < 0x8000);
                                uVar45 = (uint)(uVar38 == 0);
                                if (uVar53 < uVar46) {
                                  uVar45 = uVar38;
                                }
                              }
                              else {
                                uVar32 = uVar32 + uVar46 * -0x10000;
                                uVar47 = uVar53;
                                if ((short)uVar53 < 0) {
                                  uVar45 = poVar12->mps;
                                }
                                else {
                                  uVar38 = poVar12->mps;
                                  *ppoVar51 = (&poVar12->nmps)[uVar53 < uVar46];
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (t1->mqc).bp;
                                      bVar27 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar27 < 0x90) {
                                          (t1->mqc).bp = pOVar24 + 1;
                                          uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_001235f9;
                                        }
                                        uVar32 = uVar32 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar24 + 1;
                                        uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_001235f9:
                                    uVar47 = uVar47 * 2;
                                    uVar32 = uVar32 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar47 < 0x8000);
                                  uVar45 = (uint)(uVar38 == 0);
                                  if (uVar46 <= uVar53) {
                                    uVar45 = uVar38;
                                  }
                                }
                              }
                              uVar46 = uVar43;
                              if (uVar45 == puVar25[0xc0] >> 0x1f) {
                                uVar46 = uVar44;
                              }
                              puVar25[0xc0] = uVar46 + puVar25[0xc0];
                              uVar37 = uVar37 | 0x20000000;
                            }
                            *puVar56 = uVar37;
                          }
                          puVar25 = puVar25 + 1;
                          puVar56 = puVar56 + 1;
                        }
                        puVar25 = puVar25 + 0xc0;
                        puVar56 = puVar56 + 2;
                      }
                      (t1->mqc).curctx = ppoVar51;
                      (t1->mqc).c = uVar32;
                      (t1->mqc).a = uVar47;
                      (t1->mqc).ct = OVar49;
                      goto LAB_00124314;
                    }
                  }
                  else {
                    puVar25 = (uint *)t1->data;
                    poVar39 = t1->flags;
                    ppoVar51 = (t1->mqc).curctx;
                    uVar32 = (t1->mqc).c;
                    uVar47 = (t1->mqc).a;
                    OVar49 = (t1->mqc).ct;
                  }
                  puVar56 = poVar39 + (uVar28 + 3);
                  uVar37 = (uint)(1 << (bVar27 & 0x1f)) >> 1;
                  uVar46 = -uVar37;
                  uVar43 = uVar28 * 3;
                  for (uVar44 = 0; uVar53 = t1->h, uVar44 < (uVar53 & 0xfffffffc);
                      uVar44 = uVar44 + 4) {
                    for (uVar53 = 0; uVar53 != uVar28; uVar53 = uVar53 + 1) {
                      uVar38 = *puVar56;
                      if (uVar38 != 0) {
                        if ((uVar38 & 0x200010) == 0x10) {
                          uVar31 = (ulong)(0xf - ((uVar38 & 0x1ef) == 0));
                          if ((uVar38 >> 0x14 & 1) != 0) {
                            uVar31 = 0x10;
                          }
                          ppoVar51 = (t1->mqc).ctxs + uVar31;
                          poVar12 = *ppoVar51;
                          uVar45 = poVar12->qeval;
                          uVar54 = uVar47 - uVar45;
                          if (uVar32 >> 0x10 < uVar45) {
                            uVar9 = poVar12->mps;
                            *ppoVar51 = (&poVar12->nmps)[uVar45 <= uVar54];
                            uVar47 = uVar45;
                            do {
                              if (OVar49 == 0) {
                                pOVar24 = (t1->mqc).bp;
                                bVar27 = pOVar24[1];
                                if (*pOVar24 == 0xff) {
                                  if (bVar27 < 0x90) {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                    OVar49 = 7;
                                    goto LAB_00123ac0;
                                  }
                                  uVar32 = uVar32 + 0xff00;
                                  pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                  *pOVar1 = *pOVar1 + 1;
                                }
                                else {
                                  (t1->mqc).bp = pOVar24 + 1;
                                  uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                }
                                OVar49 = 8;
                              }
LAB_00123ac0:
                              uVar47 = uVar47 * 2;
                              uVar32 = uVar32 * 2;
                              OVar49 = OVar49 - 1;
                            } while (uVar47 < 0x8000);
                            uVar61 = (uint)(uVar9 == 0);
                            if (uVar54 < uVar45) {
                              uVar61 = uVar9;
                            }
                          }
                          else {
                            uVar32 = uVar32 + uVar45 * -0x10000;
                            uVar47 = uVar54;
                            if ((short)uVar54 < 0) {
                              uVar61 = poVar12->mps;
                            }
                            else {
                              uVar9 = poVar12->mps;
                              *ppoVar51 = (&poVar12->nmps)[uVar54 < uVar45];
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (t1->mqc).bp;
                                  bVar27 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar27 < 0x90) {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_00123b4a;
                                    }
                                    uVar32 = uVar32 + 0xff00;
                                    pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_00123b4a:
                                uVar47 = uVar47 * 2;
                                uVar32 = uVar32 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar47 < 0x8000);
                              uVar61 = (uint)(uVar9 == 0);
                              if (uVar45 <= uVar54) {
                                uVar61 = uVar9;
                              }
                            }
                          }
                          uVar45 = uVar37;
                          if (uVar61 == *puVar25 >> 0x1f) {
                            uVar45 = uVar46;
                          }
                          *puVar25 = uVar45 + *puVar25;
                          uVar38 = uVar38 | 0x100000;
                        }
                        if ((uVar38 & 0x1000080) == 0x80) {
                          uVar31 = (ulong)(0xf - ((uVar38 & 0xf78) == 0));
                          if ((uVar38 >> 0x17 & 1) != 0) {
                            uVar31 = 0x10;
                          }
                          ppoVar51 = (t1->mqc).ctxs + uVar31;
                          poVar12 = *ppoVar51;
                          uVar45 = poVar12->qeval;
                          uVar54 = uVar47 - uVar45;
                          if (uVar32 >> 0x10 < uVar45) {
                            uVar9 = poVar12->mps;
                            *ppoVar51 = (&poVar12->nmps)[uVar45 <= uVar54];
                            uVar47 = uVar45;
                            do {
                              if (OVar49 == 0) {
                                pOVar24 = (t1->mqc).bp;
                                bVar27 = pOVar24[1];
                                if (*pOVar24 == 0xff) {
                                  if (bVar27 < 0x90) {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                    OVar49 = 7;
                                    goto LAB_00123c52;
                                  }
                                  uVar32 = uVar32 + 0xff00;
                                  pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                  *pOVar1 = *pOVar1 + 1;
                                }
                                else {
                                  (t1->mqc).bp = pOVar24 + 1;
                                  uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                }
                                OVar49 = 8;
                              }
LAB_00123c52:
                              uVar47 = uVar47 * 2;
                              uVar32 = uVar32 * 2;
                              OVar49 = OVar49 - 1;
                            } while (uVar47 < 0x8000);
                            uVar61 = (uint)(uVar9 == 0);
                            if (uVar54 < uVar45) {
                              uVar61 = uVar9;
                            }
                          }
                          else {
                            uVar32 = uVar32 + uVar45 * -0x10000;
                            uVar47 = uVar54;
                            if ((short)uVar54 < 0) {
                              uVar61 = poVar12->mps;
                            }
                            else {
                              uVar9 = poVar12->mps;
                              *ppoVar51 = (&poVar12->nmps)[uVar54 < uVar45];
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (t1->mqc).bp;
                                  bVar27 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar27 < 0x90) {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_00123cdc;
                                    }
                                    uVar32 = uVar32 + 0xff00;
                                    pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_00123cdc:
                                uVar47 = uVar47 * 2;
                                uVar32 = uVar32 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar47 < 0x8000);
                              uVar61 = (uint)(uVar9 == 0);
                              if (uVar45 <= uVar54) {
                                uVar61 = uVar9;
                              }
                            }
                          }
                          uVar45 = uVar37;
                          if (uVar61 == puVar25[uVar41] >> 0x1f) {
                            uVar45 = uVar46;
                          }
                          puVar25[uVar41] = uVar45 + puVar25[uVar41];
                          uVar38 = uVar38 | 0x800000;
                        }
                        if ((uVar38 & 0x8000400) == 0x400) {
                          uVar31 = (ulong)(0xf - ((uVar38 & 0x7bc0) == 0));
                          if ((uVar38 >> 0x1a & 1) != 0) {
                            uVar31 = 0x10;
                          }
                          ppoVar51 = (t1->mqc).ctxs + uVar31;
                          poVar12 = *ppoVar51;
                          uVar45 = poVar12->qeval;
                          uVar54 = uVar47 - uVar45;
                          if (uVar32 >> 0x10 < uVar45) {
                            uVar9 = poVar12->mps;
                            *ppoVar51 = (&poVar12->nmps)[uVar45 <= uVar54];
                            uVar47 = uVar45;
                            do {
                              if (OVar49 == 0) {
                                pOVar24 = (t1->mqc).bp;
                                bVar27 = pOVar24[1];
                                if (*pOVar24 == 0xff) {
                                  if (bVar27 < 0x90) {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                    OVar49 = 7;
                                    goto LAB_00123deb;
                                  }
                                  uVar32 = uVar32 + 0xff00;
                                  pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                  *pOVar1 = *pOVar1 + 1;
                                }
                                else {
                                  (t1->mqc).bp = pOVar24 + 1;
                                  uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                }
                                OVar49 = 8;
                              }
LAB_00123deb:
                              uVar47 = uVar47 * 2;
                              uVar32 = uVar32 * 2;
                              OVar49 = OVar49 - 1;
                            } while (uVar47 < 0x8000);
                            uVar61 = (uint)(uVar9 == 0);
                            if (uVar54 < uVar45) {
                              uVar61 = uVar9;
                            }
                          }
                          else {
                            uVar32 = uVar32 + uVar45 * -0x10000;
                            uVar47 = uVar54;
                            if ((short)uVar54 < 0) {
                              uVar61 = poVar12->mps;
                            }
                            else {
                              uVar9 = poVar12->mps;
                              *ppoVar51 = (&poVar12->nmps)[uVar54 < uVar45];
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (t1->mqc).bp;
                                  bVar27 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar27 < 0x90) {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_00123e75;
                                    }
                                    uVar32 = uVar32 + 0xff00;
                                    pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_00123e75:
                                uVar47 = uVar47 * 2;
                                uVar32 = uVar32 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar47 < 0x8000);
                              uVar61 = (uint)(uVar9 == 0);
                              if (uVar45 <= uVar54) {
                                uVar61 = uVar9;
                              }
                            }
                          }
                          uVar45 = uVar37;
                          if (uVar61 == puVar25[uVar28 * 2] >> 0x1f) {
                            uVar45 = uVar46;
                          }
                          puVar25[uVar28 * 2] = uVar45 + puVar25[uVar28 * 2];
                          uVar38 = uVar38 | 0x4000000;
                        }
                        if ((uVar38 & 0x40002000) == 0x2000) {
                          uVar31 = (ulong)(0xf - ((uVar38 & 0x3de00) == 0));
                          if ((uVar38 >> 0x1d & 1) != 0) {
                            uVar31 = 0x10;
                          }
                          ppoVar51 = (t1->mqc).ctxs + uVar31;
                          poVar12 = *ppoVar51;
                          uVar45 = poVar12->qeval;
                          uVar54 = uVar47 - uVar45;
                          if (uVar32 >> 0x10 < uVar45) {
                            uVar9 = poVar12->mps;
                            *ppoVar51 = (&poVar12->nmps)[uVar45 <= uVar54];
                            uVar47 = uVar45;
                            do {
                              if (OVar49 == 0) {
                                pOVar24 = (t1->mqc).bp;
                                bVar27 = pOVar24[1];
                                if (*pOVar24 == 0xff) {
                                  if (bVar27 < 0x90) {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                    OVar49 = 7;
                                    goto LAB_00123f87;
                                  }
                                  uVar32 = uVar32 + 0xff00;
                                  pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                  *pOVar1 = *pOVar1 + 1;
                                }
                                else {
                                  (t1->mqc).bp = pOVar24 + 1;
                                  uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                }
                                OVar49 = 8;
                              }
LAB_00123f87:
                              uVar47 = uVar47 * 2;
                              uVar32 = uVar32 * 2;
                              OVar49 = OVar49 - 1;
                            } while (uVar47 < 0x8000);
                            uVar61 = (uint)(uVar9 == 0);
                            if (uVar54 < uVar45) {
                              uVar61 = uVar9;
                            }
                          }
                          else {
                            uVar32 = uVar32 + uVar45 * -0x10000;
                            uVar47 = uVar54;
                            if ((short)uVar54 < 0) {
                              uVar61 = poVar12->mps;
                            }
                            else {
                              uVar9 = poVar12->mps;
                              *ppoVar51 = (&poVar12->nmps)[uVar54 < uVar45];
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (t1->mqc).bp;
                                  bVar27 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar27 < 0x90) {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      uVar32 = uVar32 + (uint)bVar27 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_00124011;
                                    }
                                    uVar32 = uVar32 + 0xff00;
                                    pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar32 = uVar32 + (uint)bVar27 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_00124011:
                                uVar47 = uVar47 * 2;
                                uVar32 = uVar32 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar47 < 0x8000);
                              uVar61 = (uint)(uVar9 == 0);
                              if (uVar45 <= uVar54) {
                                uVar61 = uVar9;
                              }
                            }
                          }
                          uVar45 = uVar37;
                          if (uVar61 == puVar25[uVar43] >> 0x1f) {
                            uVar45 = uVar46;
                          }
                          puVar25[uVar43] = uVar45 + puVar25[uVar43];
                          uVar38 = uVar38 | 0x20000000;
                        }
                        *puVar56 = uVar38;
                      }
                      puVar25 = puVar25 + 1;
                      puVar56 = puVar56 + 1;
                    }
                    puVar25 = puVar25 + uVar43;
                    puVar56 = puVar56 + 2;
                  }
                  (t1->mqc).curctx = ppoVar51;
                  (t1->mqc).c = uVar32;
                  (t1->mqc).a = uVar47;
                  (t1->mqc).ct = OVar49;
                  if (uVar44 < uVar53) {
                    for (uVar32 = 0; uVar32 != uVar28; uVar32 = uVar32 + 1) {
                      for (uVar41 = 0; uVar41 < uVar53 - uVar44; uVar41 = uVar41 + 1) {
                        bVar27 = (char)uVar41 * '\x03';
                        if ((0x200010 << (bVar27 & 0x1f) & *puVar56) == 0x10 << (bVar27 & 0x1f)) {
                          uVar47 = *puVar56 >> (bVar27 & 0x1f);
                          iVar33 = 0xf - (uint)((uVar47 & 0x1ef) == 0);
                          if ((uVar47 >> 0x14 & 1) != 0) {
                            iVar33 = 0x10;
                          }
                          ppoVar51 = (opj_mqc_state_t **)
                                     ((long)(t1->mqc).ctxs + (ulong)(uint)(iVar33 << 3));
                          (t1->mqc).curctx = ppoVar51;
                          puVar13 = *(uint **)((long)(t1->mqc).ctxs + (ulong)(uint)(iVar33 << 3));
                          uVar47 = *puVar13;
                          uVar43 = (t1->mqc).c;
                          uVar53 = (t1->mqc).a - uVar47;
                          (t1->mqc).a = uVar53;
                          if (uVar43 >> 0x10 < uVar47) {
                            uVar38 = puVar13[1];
                            (t1->mqc).a = uVar47;
                            *ppoVar51 = *(opj_mqc_state_t **)
                                         (puVar13 + (ulong)(uVar47 <= uVar53) * 2 + 2);
                            OVar49 = (t1->mqc).ct;
                            uVar45 = uVar47;
                            do {
                              if (OVar49 == 0) {
                                pOVar24 = (t1->mqc).bp;
                                bVar5 = pOVar24[1];
                                if (*pOVar24 == 0xff) {
                                  if (bVar5 < 0x90) {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    uVar43 = uVar43 + (uint)bVar5 * 0x200;
                                    OVar49 = 7;
                                    goto LAB_001241c3;
                                  }
                                  uVar43 = uVar43 + 0xff00;
                                  pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                  *pOVar1 = *pOVar1 + 1;
                                }
                                else {
                                  (t1->mqc).bp = pOVar24 + 1;
                                  uVar43 = uVar43 + (uint)bVar5 * 0x100;
                                }
                                OVar49 = 8;
                              }
LAB_001241c3:
                              uVar45 = uVar45 * 2;
                              (t1->mqc).a = uVar45;
                              uVar43 = uVar43 * 2;
                              (t1->mqc).c = uVar43;
                              OVar49 = OVar49 - 1;
                              (t1->mqc).ct = OVar49;
                            } while (uVar45 < 0x8000);
                            uVar43 = (uint)(uVar38 == 0);
                            if (uVar53 < uVar47) {
                              uVar43 = uVar38;
                            }
                          }
                          else {
                            OVar49 = uVar43 + uVar47 * -0x10000;
                            (t1->mqc).c = OVar49;
                            if ((short)uVar53 < 0) {
                              uVar43 = puVar13[1];
                            }
                            else {
                              uVar38 = puVar13[1];
                              *ppoVar51 = *(opj_mqc_state_t **)
                                           (puVar13 + (ulong)(uVar53 < uVar47) * 2 + 2);
                              OVar58 = (t1->mqc).ct;
                              uVar43 = uVar53;
                              do {
                                if (OVar58 == 0) {
                                  pOVar24 = (t1->mqc).bp;
                                  bVar5 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar5 < 0x90) {
                                      (t1->mqc).bp = pOVar24 + 1;
                                      OVar49 = OVar49 + (uint)bVar5 * 0x200;
                                      OVar58 = 7;
                                      goto LAB_0012425b;
                                    }
                                    OVar49 = OVar49 + 0xff00;
                                    pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (t1->mqc).bp = pOVar24 + 1;
                                    OVar49 = OVar49 + (uint)bVar5 * 0x100;
                                  }
                                  OVar58 = 8;
                                }
LAB_0012425b:
                                uVar43 = uVar43 * 2;
                                (t1->mqc).a = uVar43;
                                OVar49 = OVar49 * 2;
                                (t1->mqc).c = OVar49;
                                OVar58 = OVar58 - 1;
                                (t1->mqc).ct = OVar58;
                              } while (uVar43 < 0x8000);
                              uVar43 = (uint)(uVar38 == 0);
                              if (uVar47 <= uVar53) {
                                uVar43 = uVar38;
                              }
                            }
                          }
                          uVar53 = uVar28 * (int)uVar41;
                          uVar47 = uVar37;
                          if (uVar43 == puVar25[uVar53] >> 0x1f) {
                            uVar47 = uVar46;
                          }
                          puVar25[uVar53] = uVar47 + puVar25[uVar53];
                          *puVar56 = *puVar56 | 0x100000 << (bVar27 & 0x1f);
                          uVar53 = t1->h;
                        }
                      }
                      puVar25 = puVar25 + 1;
                      puVar56 = puVar56 + 1;
                    }
                  }
                }
                else {
                  pOVar59 = t1->data;
                  uVar28 = t1->w;
                  poVar39 = t1->flags + (uVar28 + 3);
                  uVar47 = (uint)(1 << (bVar27 & 0x1f)) >> 1;
                  for (uVar32 = 0; uVar43 = t1->h, uVar41 = (ulong)uVar28,
                      uVar32 < (uVar43 & 0xfffffffc); uVar32 = uVar32 + 4) {
                    while ((int)uVar41 != 0) {
                      if (*poVar39 != 0) {
                        opj_t1_dec_refpass_step_raw(t1,poVar39,pOVar59,uVar47,0);
                        opj_t1_dec_refpass_step_raw(t1,poVar39,pOVar59 + uVar28,uVar47,1);
                        opj_t1_dec_refpass_step_raw(t1,poVar39,pOVar59 + uVar28 * 2,uVar47,2);
                        opj_t1_dec_refpass_step_raw(t1,poVar39,pOVar59 + uVar28 * 3,uVar47,3);
                      }
                      poVar39 = poVar39 + 1;
                      pOVar59 = pOVar59 + 1;
                      uVar41 = (ulong)((int)uVar41 - 1);
                    }
                    poVar39 = poVar39 + 2;
                    pOVar59 = pOVar59 + uVar28 * 3;
                  }
                  if (uVar32 < uVar43) {
                    for (uVar44 = 0; uVar44 != uVar28; uVar44 = uVar44 + 1) {
                      uVar31 = 0;
                      for (uVar41 = 0; uVar41 < uVar43 - uVar32; uVar41 = uVar41 + 1) {
                        opj_t1_dec_refpass_step_raw
                                  (t1,poVar39,pOVar59 + uVar31,uVar47,(OPJ_UINT32)uVar41);
                        uVar43 = t1->h;
                        uVar31 = (ulong)((int)uVar31 + uVar28);
                      }
                      poVar39 = poVar39 + 1;
                      pOVar59 = pOVar59 + 1;
                    }
                  }
                }
              }
              else if ((bVar64 || bVar66) || bVar65) {
                opj_t1_dec_sigpass_mqc(t1,uVar35,uVar48);
              }
              else {
                pOVar59 = t1->data;
                uVar28 = t1->w;
                poVar39 = t1->flags + (uVar28 + 3);
                uVar47 = (uint)(1 << (bVar27 & 0x1f)) >> 1 | 1 << (uVar35 & 0x1f);
                for (uVar32 = 0; uVar43 = t1->h, uVar41 = (ulong)uVar28,
                    uVar32 < (uVar43 & 0xfffffffc); uVar32 = uVar32 + 4) {
                  while ((int)uVar41 != 0) {
                    if (*poVar39 != 0) {
                      opj_t1_dec_sigpass_step_raw(t1,poVar39,pOVar59,uVar47,uVar48 & 8,0);
                      opj_t1_dec_sigpass_step_raw(t1,poVar39,pOVar59 + uVar28,uVar47,0,1);
                      opj_t1_dec_sigpass_step_raw(t1,poVar39,pOVar59 + uVar28 * 2,uVar47,0,2);
                      opj_t1_dec_sigpass_step_raw(t1,poVar39,pOVar59 + uVar28 * 3,uVar47,0,3);
                    }
                    poVar39 = poVar39 + 1;
                    pOVar59 = pOVar59 + 1;
                    uVar41 = (ulong)((int)uVar41 - 1);
                  }
                  poVar39 = poVar39 + 2;
                  pOVar59 = pOVar59 + uVar28 * 3;
                }
                if (uVar32 < uVar43) {
                  for (uVar44 = 0; uVar44 != uVar28; uVar44 = uVar44 + 1) {
                    uVar31 = 0;
                    for (uVar41 = 0; uVar41 < uVar43 - uVar32; uVar41 = uVar41 + 1) {
                      opj_t1_dec_sigpass_step_raw
                                (t1,poVar39,pOVar59 + uVar31,uVar47,uVar48 & 8,(OPJ_UINT32)uVar41);
                      uVar43 = t1->h;
                      uVar31 = (ulong)((int)uVar31 + uVar28);
                    }
                    poVar39 = poVar39 + 1;
                    pOVar59 = pOVar59 + 1;
                  }
                }
              }
            }
LAB_00124314:
            if (((byte)uVar48 >> 1 & ((bVar64 || bVar66) || bVar65)) != 0) {
              opj_mqc_resetstates(&t1->mqc);
              opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
              opj_mqc_setstate(&t1->mqc,0x11,0,3);
              opj_mqc_setstate(&t1->mqc,0,0,4);
            }
            uVar28 = uVar36 + 1;
            uVar36 = uVar28;
            if (uVar28 == 3) {
              uVar36 = 0;
            }
            uVar29 = uVar29 + 1;
          }
          opq_mqc_finish_dec(&t1->mqc);
        }
        if (iVar50 != 0) {
          pOVar24 = (t1->mqc).bp;
          pOVar52 = (t1->mqc).end;
          if (pOVar24 + 2 < pOVar52) {
            if (mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(mutex);
              pOVar24 = (t1->mqc).bp;
              pOVar52 = (t1->mqc).end;
            }
            iVar33 = *(int *)&(t1->mqc).start;
            opj_event_msg(p_event_mgr,2,
                          "PTERM check failure: %d remaining bytes in code block (%d used / %d)\n",
                          (ulong)(((int)pOVar52 - (int)pOVar24) - 2),
                          (ulong)(uint)((int)pOVar24 - iVar33),(ulong)(uint)((int)pOVar52 - iVar33))
            ;
            if (mutex != (opj_mutex_t *)0x0) {
LAB_00124456:
              opj_mutex_unlock(mutex);
            }
          }
          else if (2 < (t1->mqc).end_of_byte_stream_counter) {
            if (mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(mutex);
              opj_event_msg(p_event_mgr,2,"PTERM check failure: %d synthetized 0xFF markers read\n")
              ;
              goto LAB_00124456;
            }
            opj_event_msg(p_event_mgr,2,"PTERM check failure: %d synthetized 0xFF markers read\n");
          }
        }
        if (plVar10[8] != 0) {
          t1->data = local_58;
        }
      }
      iVar33 = (int)plVar10[2] - *piVar60;
      if ((piVar60[4] & 1U) != 0) {
        lVar30 = (ulong)(iVar6 - 1) * 0xc0;
        iVar33 = (iVar33 + *(int *)(*(long *)(lVar26 + 0x20) + 8 + lVar30)) -
                 *(int *)(*(long *)(lVar26 + 0x20) + lVar30);
      }
      iVar50 = *(int *)((long)plVar10 + 0x14) - piVar60[1];
      if ((piVar60[4] & 2U) != 0) {
        lVar30 = (ulong)(iVar6 - 1) * 0xc0;
        iVar50 = (iVar50 + *(int *)(*(long *)(lVar26 + 0x20) + 0xc + lVar30)) -
                 *(int *)(*(long *)(lVar26 + 0x20) + 4 + lVar30);
      }
      piVar62 = (int *)plVar10[8];
      piVar42 = piVar62;
      if (piVar62 == (int *)0x0) {
        piVar42 = t1->data;
      }
      uVar48 = t1->w;
      uVar34 = (ulong)uVar48;
      uVar35 = t1->h;
      iVar6 = *(int *)(lVar11 + 0x328);
      if (iVar6 != 0) {
        if (iVar6 < 0x1f) {
          uVar41 = 0;
          for (uVar36 = 0; uVar36 != uVar35; uVar36 = uVar36 + 1) {
            iVar55 = (int)uVar41;
            uVar31 = uVar34;
            while (bVar65 = uVar31 != 0, uVar31 = uVar31 - 1, bVar65) {
              uVar29 = piVar42[uVar41];
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              if (uVar28 >> ((byte)iVar6 & 0x1f) != 0) {
                uVar28 = uVar28 >> (*(byte *)(lVar11 + 0x328) & 0x1f);
                uVar32 = -uVar28;
                if (-1 < (int)uVar29) {
                  uVar32 = uVar28;
                }
                piVar42[uVar41] = uVar32;
              }
              uVar41 = (ulong)((int)uVar41 + 1);
            }
            uVar41 = (ulong)(iVar55 + uVar48);
          }
        }
        else {
          uVar36 = 0;
          for (uVar29 = 0; uVar41 = uVar34, uVar28 = uVar36, uVar29 != uVar35; uVar29 = uVar29 + 1)
          {
            while( true ) {
              if (uVar41 == 0) break;
              piVar42[uVar28] = 0;
              uVar41 = uVar41 - 1;
              uVar28 = uVar28 + 1;
            }
            uVar36 = uVar36 + uVar48;
          }
        }
      }
      if (piVar62 == (int *)0x0) {
        if (*(long *)(lVar26 + 0x30) == 0) {
          __assert_fail("(cblk->decoded_data != NULL) || (tilec->data != NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                        ,0x6b7,"void opj_t1_clbl_decode_processor(void *, opj_tls_t *)");
        }
        uVar41 = (ulong)(uint)(iVar7 - iVar8);
        piVar62 = (int *)(*(long *)(lVar26 + 0x30) + (long)iVar50 * uVar41 * 4 + (long)iVar33 * 4);
        if (*(int *)(lVar11 + 0x14) == 1) {
          uVar57 = 0;
          for (uVar31 = 0; uVar31 != uVar35; uVar31 = uVar31 + 1) {
            uVar40 = uVar57 & 0xffffffff;
            piVar60 = piVar62;
            for (uVar63 = 0; uVar63 < (uVar48 & 0xfffffffc); uVar63 = uVar63 + 4) {
              iVar33 = (int)uVar57;
              iVar50 = (int)uVar63;
              iVar6 = piVar42[(uint)(iVar33 + 3 + iVar50)];
              iVar7 = piVar42[(uint)(iVar33 + 2 + iVar50)];
              iVar8 = piVar42[iVar33 + iVar50 + 1];
              piVar2 = piVar62 + uVar63;
              *piVar2 = piVar42[(uint)(iVar33 + iVar50)] / 2;
              piVar2[1] = iVar8 / 2;
              piVar2[2] = iVar7 / 2;
              piVar2[3] = iVar6 / 2;
              uVar40 = (ulong)((int)uVar40 + 4);
              piVar60 = piVar60 + 4;
            }
            for (; uVar63 < uVar34; uVar63 = uVar63 + 1) {
              *piVar60 = piVar42[uVar40] / 2;
              uVar40 = (ulong)((int)uVar40 + 1);
              piVar60 = piVar60 + 1;
            }
            uVar57 = uVar57 + uVar34;
            piVar62 = piVar62 + uVar41;
          }
        }
        else {
          for (uVar36 = 0; uVar36 != uVar35; uVar36 = uVar36 + 1) {
            for (lVar26 = 0; uVar48 != (uint)lVar26; lVar26 = lVar26 + 1) {
              piVar62[lVar26] = (int)((float)*piVar42 * (float)piVar60[10]);
              piVar42 = piVar42 + 1;
            }
            piVar62 = piVar62 + uVar41;
          }
        }
      }
      else {
        uVar48 = uVar48 * uVar35;
        if (*(int *)(lVar11 + 0x14) == 1) {
          for (uVar34 = 0; uVar48 != uVar34; uVar34 = uVar34 + 1) {
            piVar42[uVar34] = piVar42[uVar34] / 2;
          }
        }
        else {
          fVar4 = (float)piVar60[10];
          for (lVar26 = 0; (uint)lVar26 < (uVar48 & 0xfffffff0); lVar26 = lVar26 + 0x10) {
            piVar62 = piVar42 + lVar26;
            iVar6 = piVar62[1];
            iVar7 = piVar62[2];
            iVar8 = piVar62[3];
            piVar2 = piVar42 + lVar26 + 4;
            iVar33 = *piVar2;
            iVar50 = piVar2[1];
            iVar55 = piVar2[2];
            iVar14 = piVar2[3];
            piVar2 = piVar42 + lVar26 + 8;
            iVar15 = *piVar2;
            iVar16 = piVar2[1];
            iVar17 = piVar2[2];
            iVar18 = piVar2[3];
            piVar2 = piVar42 + lVar26 + 0xc;
            iVar19 = *piVar2;
            iVar20 = piVar2[1];
            iVar21 = piVar2[2];
            iVar22 = piVar2[3];
            pfVar3 = (float *)(piVar42 + lVar26);
            *pfVar3 = (float)*piVar62 * fVar4;
            pfVar3[1] = (float)iVar6 * fVar4;
            pfVar3[2] = (float)iVar7 * fVar4;
            pfVar3[3] = (float)iVar8 * fVar4;
            pfVar3 = (float *)(piVar42 + lVar26 + 4);
            *pfVar3 = (float)iVar33 * fVar4;
            pfVar3[1] = (float)iVar50 * fVar4;
            pfVar3[2] = (float)iVar55 * fVar4;
            pfVar3[3] = (float)iVar14 * fVar4;
            pfVar3 = (float *)(piVar42 + lVar26 + 8);
            *pfVar3 = (float)iVar15 * fVar4;
            pfVar3[1] = (float)iVar16 * fVar4;
            pfVar3[2] = (float)iVar17 * fVar4;
            pfVar3[3] = (float)iVar18 * fVar4;
            pfVar3 = (float *)(piVar42 + lVar26 + 0xc);
            *pfVar3 = (float)iVar19 * fVar4;
            pfVar3[1] = (float)iVar20 * fVar4;
            pfVar3[2] = (float)iVar21 * fVar4;
            pfVar3[3] = (float)iVar22 * fVar4;
          }
          for (; (uint)lVar26 < uVar48; lVar26 = lVar26 + 1) {
            piVar42[lVar26] = (int)((float)piVar42[lVar26] * (float)piVar60[10]);
          }
        }
      }
      goto LAB_00122ddd;
    }
    if (mutex == (opj_mutex_t *)0x0) {
      opj_event_msg(p_event_mgr,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                    (ulong)uVar35);
    }
    else {
      opj_mutex_lock(mutex);
      opj_event_msg(p_event_mgr,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                    (ulong)uVar35);
      opj_mutex_unlock(mutex);
    }
  }
LAB_00122dd4:
  **(undefined4 **)((long)user_data + 0x30) = 0;
LAB_00122ddd:
  opj_free(user_data);
  return;
}

Assistant:

static void opj_t1_clbl_decode_processor(void* user_data, opj_tls_t* tls)
{
    opj_tcd_cblk_dec_t* cblk;
    opj_tcd_band_t* band;
    opj_tcd_tilecomp_t* tilec;
    opj_tccp_t* tccp;
    OPJ_INT32* OPJ_RESTRICT datap;
    OPJ_UINT32 cblk_w, cblk_h;
    OPJ_INT32 x, y;
    OPJ_UINT32 i, j;
    opj_t1_cblk_decode_processing_job_t* job;
    opj_t1_t* t1;
    OPJ_UINT32 resno;
    OPJ_UINT32 tile_w;

    job = (opj_t1_cblk_decode_processing_job_t*) user_data;

    cblk = job->cblk;

    if (!job->whole_tile_decoding) {
        cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
        cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

        cblk->decoded_data = (OPJ_INT32*)opj_aligned_malloc(sizeof(OPJ_INT32) *
                             cblk_w * cblk_h);
        if (cblk->decoded_data == NULL) {
            if (job->p_manager_mutex) {
                opj_mutex_lock(job->p_manager_mutex);
            }
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate cblk->decoded_data\n");
            if (job->p_manager_mutex) {
                opj_mutex_unlock(job->p_manager_mutex);
            }
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        /* Zero-init required */
        memset(cblk->decoded_data, 0, sizeof(OPJ_INT32) * cblk_w * cblk_h);
    } else if (cblk->decoded_data) {
        /* Not sure if that code path can happen, but better be */
        /* safe than sorry */
        opj_aligned_free(cblk->decoded_data);
        cblk->decoded_data = NULL;
    }

    resno = job->resno;
    band = job->band;
    tilec = job->tilec;
    tccp = job->tccp;
    tile_w = (OPJ_UINT32)(tilec->resolutions[tilec->minimum_num_resolutions - 1].x1
                          -
                          tilec->resolutions[tilec->minimum_num_resolutions - 1].x0);

    if (!*(job->pret)) {
        opj_free(job);
        return;
    }

    t1 = (opj_t1_t*) opj_tls_get(tls, OPJ_TLS_KEY_T1);
    if (t1 == NULL) {
        t1 = opj_t1_create(OPJ_FALSE);
        opj_tls_set(tls, OPJ_TLS_KEY_T1, t1, opj_t1_destroy_wrapper);
    }
    t1->mustuse_cblkdatabuffer = job->mustuse_cblkdatabuffer;

    if (OPJ_FALSE == opj_t1_decode_cblk(
                t1,
                cblk,
                band->bandno,
                (OPJ_UINT32)tccp->roishift,
                tccp->cblksty,
                job->p_manager,
                job->p_manager_mutex,
                job->check_pterm)) {
        *(job->pret) = OPJ_FALSE;
        opj_free(job);
        return;
    }

    x = cblk->x0 - band->x0;
    y = cblk->y0 - band->y0;
    if (band->bandno & 1) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        x += pres->x1 - pres->x0;
    }
    if (band->bandno & 2) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        y += pres->y1 - pres->y0;
    }

    datap = cblk->decoded_data ? cblk->decoded_data : t1->data;
    cblk_w = t1->w;
    cblk_h = t1->h;

    if (tccp->roishift) {
        if (tccp->roishift >= 31) {
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    datap[(j * cblk_w) + i] = 0;
                }
            }
        } else {
            OPJ_INT32 thresh = 1 << tccp->roishift;
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    OPJ_INT32 val = datap[(j * cblk_w) + i];
                    OPJ_INT32 mag = abs(val);
                    if (mag >= thresh) {
                        mag >>= tccp->roishift;
                        datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
                    }
                }
            }
        }
    }

    /* Both can be non NULL if for example decoding a full tile and then */
    /* partially a tile. In which case partial decoding should be the */
    /* priority */
    assert((cblk->decoded_data != NULL) || (tilec->data != NULL));

    if (cblk->decoded_data) {
        OPJ_UINT32 cblk_size = cblk_w * cblk_h;
        if (tccp->qmfbid == 1) {
            for (i = 0; i < cblk_size; ++i) {
                datap[i] /= 2;
            }
        } else {        /* if (tccp->qmfbid == 0) */
            i = 0;
#ifdef __SSE2__
            {
                const __m128 xmm_stepsize = _mm_set1_ps(band->stepsize);
                for (; i < (cblk_size & ~15U); i += 16) {
                    __m128 xmm0_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 0)));
                    __m128 xmm1_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 4)));
                    __m128 xmm2_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 8)));
                    __m128 xmm3_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 12)));
                    _mm_store_ps((float*)(datap +  0), _mm_mul_ps(xmm0_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  4), _mm_mul_ps(xmm1_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  8), _mm_mul_ps(xmm2_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap + 12), _mm_mul_ps(xmm3_data, xmm_stepsize));
                    datap += 16;
                }
            }
#endif
            for (; i < cblk_size; ++i) {
                OPJ_FLOAT32 tmp = ((OPJ_FLOAT32)(*datap)) * band->stepsize;
                memcpy(datap, &tmp, sizeof(tmp));
                datap++;
            }
        }
    } else if (tccp->qmfbid == 1) {
        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w +
                                                       (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            i = 0;
            for (; i < (cblk_w & ~(OPJ_UINT32)3U); i += 4U) {
                OPJ_INT32 tmp0 = datap[(j * cblk_w) + i + 0U];
                OPJ_INT32 tmp1 = datap[(j * cblk_w) + i + 1U];
                OPJ_INT32 tmp2 = datap[(j * cblk_w) + i + 2U];
                OPJ_INT32 tmp3 = datap[(j * cblk_w) + i + 3U];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 0U] = tmp0 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 1U] = tmp1 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 2U] = tmp2 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 3U] = tmp3 / 2;
            }
            for (; i < cblk_w; ++i) {
                OPJ_INT32 tmp = datap[(j * cblk_w) + i];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i] = tmp / 2;
            }
        }
    } else {        /* if (tccp->qmfbid == 0) */
        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_SIZE_T)y *
                                                         tile_w + (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
            for (i = 0; i < cblk_w; ++i) {
                OPJ_FLOAT32 tmp = (OPJ_FLOAT32) * datap * band->stepsize;
                *tiledp2 = tmp;
                datap++;
                tiledp2++;
            }
            tiledp += tile_w;
        }
    }

    opj_free(job);
}